

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodePtr xmlXPathNextFollowing(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlXPathContextPtr pxVar1;
  xmlDocPtr pxVar2;
  bool bVar3;
  
  if ((ctxt != (xmlXPathParserContextPtr)0x0) &&
     (pxVar1 = ctxt->context, pxVar1 != (xmlXPathContextPtr)0x0)) {
    if (cur == (xmlNodePtr)0x0) {
      cur = pxVar1->node;
      if (((xmlDocPtr)cur)->type == XML_NAMESPACE_DECL) {
        pxVar2 = (xmlDocPtr)((xmlDocPtr)cur)->_private;
        if (pxVar2 == (xmlDocPtr)0x0) {
          bVar3 = false;
        }
        else {
          bVar3 = pxVar2->type != XML_NAMESPACE_DECL;
          if (bVar3) {
            cur = (xmlNodePtr)pxVar2;
          }
        }
        if (!bVar3) {
          return (xmlNodePtr)0x0;
        }
      }
      else if (((xmlDocPtr)cur)->type == XML_ATTRIBUTE_NODE) {
        cur = ((xmlDocPtr)cur)->parent;
      }
    }
    else if (((cur->type | XML_ATTRIBUTE_DECL) != XML_NAMESPACE_DECL) &&
            (cur->children != (xmlNodePtr)0x0)) {
      return cur->children;
    }
    if ((xmlDocPtr)cur != (xmlDocPtr)0x0) {
      do {
        if (((xmlDocPtr)cur)->next != (xmlNodePtr)0x0) {
          return ((xmlDocPtr)cur)->next;
        }
        cur = ((xmlDocPtr)cur)->parent;
        if ((xmlDocPtr)cur == (xmlDocPtr)0x0) {
          return (xmlNodePtr)0x0;
        }
      } while ((xmlDocPtr)cur != pxVar1->doc);
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextFollowing(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if ((cur != NULL) && (cur->type  != XML_ATTRIBUTE_NODE) &&
        (cur->type != XML_NAMESPACE_DECL) && (cur->children != NULL))
        return(cur->children);

    if (cur == NULL) {
        cur = ctxt->context->node;
        if (cur->type == XML_ATTRIBUTE_NODE) {
            cur = cur->parent;
        } else if (cur->type == XML_NAMESPACE_DECL) {
            xmlNsPtr ns = (xmlNsPtr) cur;

            if ((ns->next == NULL) ||
                (ns->next->type == XML_NAMESPACE_DECL))
                return (NULL);
            cur = (xmlNodePtr) ns->next;
        }
    }
    if (cur == NULL) return(NULL) ; /* ERROR */
    if (cur->next != NULL) return(cur->next) ;
    do {
        cur = cur->parent;
        if (cur == NULL) break;
        if (cur == (xmlNodePtr) ctxt->context->doc) return(NULL);
        if (cur->next != NULL) return(cur->next);
    } while (cur != NULL);
    return(cur);
}